

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::PositionCommand(UCIAdapter *this,char *params)

{
  byte *pbVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar6;
  _func_int **__s1;
  char *pcVar7;
  char *move;
  Output local_40;
  Output local_38;
  
  sVar2 = DAT_001b6788;
  if (((params == (char *)0x0) || (*params == '\0')) ||
     (((DAT_001b6788 != 0 &&
       (iVar5 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788), iVar5 == 0)) &&
      ((params[sVar2] == '\0' || (iVar5 = isspace((int)params[sVar2]), iVar5 != 0)))))) {
    Output::Output(&local_40,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Position_abi_cxx11_,DAT_001b6888);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::StartPos_abi_cxx11_,DAT_001b6928);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Fen_abi_cxx11_,DAT_001b6748);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," <fen_string>} [<movelist>]",0x1b);
    Output::~Output(&local_40);
    Output::Output(&local_40,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Set a new position and apply <movelist> (if given).",0x33);
    Output::~Output(&local_40);
    return;
  }
  iVar5 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar5 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
    (this->lastPosition)._M_string_length = 0;
    *(this->lastPosition)._M_dataplus._M_p = '\0';
  }
  sVar2 = (this->lastPosition)._M_string_length;
  if ((sVar2 == 0) ||
     (iVar5 = strncmp(params,(this->lastPosition)._M_dataplus._M_p,sVar2), iVar5 != 0)) {
    sVar2 = DAT_001b6928;
    if ((DAT_001b6928 != 0) &&
       (iVar5 = strncmp(params,token::StartPos_abi_cxx11_,DAT_001b6928), iVar5 == 0)) {
      __s1 = (_func_int **)(params + sVar2);
      uVar6 = (uint)params[sVar2];
      if (uVar6 != 0) {
        iVar5 = isspace(uVar6);
        if (iVar5 == 0) goto LAB_00133062;
        do {
          iVar5 = isspace((int)(char)uVar6);
          if (iVar5 == 0) break;
          pbVar1 = (byte *)((long)__s1 + 1);
          uVar6 = (uint)*pbVar1;
          __s1 = (_func_int **)((long)__s1 + 1);
        } while (*pbVar1 != 0);
      }
      iVar5 = (*this->engine->_vptr_ChessEngine[9])();
      if (CONCAT44(extraout_var_01,iVar5) == 0) {
        return;
      }
LAB_001330a7:
      cVar3 = *(char *)__s1;
      while ((cVar3 != '\0' && (iVar5 = isspace((int)cVar3), iVar5 != 0))) {
        cVar3 = *(char *)((long)__s1 + 1);
        __s1 = (_func_int **)((long)__s1 + 1);
      }
      goto LAB_00133210;
    }
LAB_00133062:
    sVar2 = DAT_001b6748;
    if ((DAT_001b6748 != 0) &&
       (iVar5 = strncmp(params,token::Fen_abi_cxx11_,DAT_001b6748), iVar5 == 0)) {
      pcVar7 = params + sVar2;
      uVar6 = (uint)params[sVar2];
      if ((uVar6 != 0) && (iVar5 = isspace(uVar6), iVar5 != 0)) {
        do {
          iVar5 = isspace((int)(char)uVar6);
          if (iVar5 == 0) break;
          pbVar1 = (byte *)(pcVar7 + 1);
          uVar6 = (uint)*pbVar1;
          pcVar7 = pcVar7 + 1;
        } while (*pbVar1 != 0);
      }
    }
    iVar5 = (*this->engine->_vptr_ChessEngine[9])();
    __s1 = (_func_int **)CONCAT44(extraout_var,iVar5);
    if (__s1 != (_func_int **)0x0) goto LAB_001330a7;
  }
  else {
    __s1 = (_func_int **)(params + sVar2);
    cVar3 = params[sVar2];
    while (cVar3 != '\0') {
      iVar5 = isspace((int)cVar3);
      if (iVar5 == 0) goto LAB_001330a7;
      pcVar7 = (char *)((long)__s1 + 1);
      __s1 = (_func_int **)((long)__s1 + 1);
      cVar3 = *pcVar7;
    }
LAB_00133210:
    sVar2 = DAT_001b67c8;
    if ((DAT_001b67c8 != 0) &&
       (iVar5 = strncmp((char *)__s1,token::Moves_abi_cxx11_,DAT_001b67c8), iVar5 == 0)) {
      uVar6 = (uint)*(char *)((long)__s1 + sVar2);
      if (uVar6 == 0) goto LAB_001333b5;
      iVar5 = isspace(uVar6);
      if (iVar5 != 0) {
        __s1 = (_func_int **)((long)__s1 + sVar2);
        do {
          iVar5 = isspace((int)(char)uVar6);
          if (iVar5 == 0) goto LAB_00133236;
          pbVar1 = (byte *)((long)__s1 + 1);
          uVar6 = (uint)*pbVar1;
          __s1 = (_func_int **)((long)__s1 + 1);
        } while (*pbVar1 != 0);
        goto LAB_001333b5;
      }
    }
LAB_00133236:
    do {
      cVar3 = *(char *)__s1;
      while( true ) {
        if (cVar3 == '\0') goto LAB_001333b5;
        iVar5 = isspace((int)cVar3);
        if (iVar5 == 0) break;
        cVar3 = *(char *)((long)__s1 + 1);
        __s1 = (_func_int **)((long)__s1 + 1);
      }
      local_40._vptr_Output = __s1;
      bVar4 = IsMove((char *)__s1);
      if (!bVar4) goto LAB_001333b5;
      iVar5 = (*this->engine->_vptr_ChessEngine[10])();
      __s1 = (_func_int **)CONCAT44(extraout_var_00,iVar5);
    } while (__s1 != (_func_int **)0x0);
    Output::Output(&local_38,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Invalid move: ",0xe);
    Output::operator<<(&local_38,(char **)&local_40);
    Output::~Output(&local_38);
  }
  params = "";
LAB_001333b5:
  pcVar7 = (char *)(this->lastPosition)._M_string_length;
  strlen(params);
  std::__cxx11::string::_M_replace((ulong)&this->lastPosition,0,pcVar7,(ulong)params);
  if (ChessEngine::_debug == '\x01') {
    (*this->engine->_vptr_ChessEngine[0xc])();
  }
  return;
}

Assistant:

void UCIAdapter::PositionCommand(const char* params)
{
  if (!params || !*params || ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Position << " {" << token::StartPos << "|"
             << token::Fen << " <fen_string>} [<movelist>]";
    Output() << "Set a new position and apply <movelist> (if given).";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
    lastPosition.clear();
  }

  const char* position = params;
  if (lastPosition.size() &&
      !strncmp(params, lastPosition.c_str(), lastPosition.size()))
  {
    NextWord(params += lastPosition.size());
  }
  else {
    if (ParamMatch(token::StartPos, params)) {
      if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
        return;
      }
    }
    else {
      ParamMatch(token::Fen, params);
      params = engine->SetPosition(params);
    }
  }

  // simply consume "moves" token if present
  NextWord(params);
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  lastPosition = params ? position : "";
  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}